

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserErrors
xmlParseBalancedChunkMemoryInternal
          (xmlParserCtxtPtr oldctxt,xmlChar *string,void *user_data,xmlNodePtr *lst)

{
  _xmlSAXHandler *p_Var1;
  int size_00;
  uint uVar2;
  xmlParserCtxtPtr ctxt_00;
  xmlChar *pxVar3;
  xmlNodePtr cur_00;
  xmlNodePtr local_78;
  xmlNodePtr cur;
  xmlParserErrors local_68;
  int i;
  xmlParserErrors ret;
  int size;
  xmlNodePtr last;
  xmlNodePtr content;
  xmlSAXHandlerPtr oldsax;
  xmlNodePtr newRoot;
  xmlDocPtr newDoc;
  xmlParserCtxtPtr ctxt;
  xmlNodePtr *lst_local;
  void *user_data_local;
  xmlChar *string_local;
  xmlParserCtxtPtr oldctxt_local;
  
  newRoot = (xmlNodePtr)0x0;
  last = (xmlNodePtr)0x0;
  _ret = (_xmlNode *)0x0;
  if (((oldctxt->depth < 0x29) || ((oldctxt->options & 0x80000U) != 0)) && (oldctxt->depth < 0x401))
  {
    if (lst != (xmlNodePtr *)0x0) {
      *lst = (xmlNodePtr)0x0;
    }
    if (string == (xmlChar *)0x0) {
      oldctxt_local._4_4_ = XML_ERR_INTERNAL_ERROR;
    }
    else {
      size_00 = xmlStrlen(string);
      ctxt_00 = xmlCreateMemoryParserCtxt((char *)string,size_00);
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        oldctxt_local._4_4_ = XML_WAR_UNDECLARED_ENTITY;
      }
      else {
        if (user_data == (void *)0x0) {
          ctxt_00->userData = ctxt_00;
        }
        else {
          ctxt_00->userData = user_data;
        }
        if (ctxt_00->dict != (xmlDictPtr)0x0) {
          xmlDictFree(ctxt_00->dict);
        }
        ctxt_00->dict = oldctxt->dict;
        ctxt_00->input_id = oldctxt->input_id + 1;
        pxVar3 = xmlDictLookup(ctxt_00->dict,"xml",3);
        ctxt_00->str_xml = pxVar3;
        pxVar3 = xmlDictLookup(ctxt_00->dict,"xmlns",5);
        ctxt_00->str_xmlns = pxVar3;
        pxVar3 = xmlDictLookup(ctxt_00->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace",0x24)
        ;
        ctxt_00->str_xml_ns = pxVar3;
        for (cur._4_4_ = 0; cur._4_4_ < oldctxt->nsNr; cur._4_4_ = cur._4_4_ + 2) {
          nsPush(ctxt_00,oldctxt->nsTab[cur._4_4_],oldctxt->nsTab[cur._4_4_ + 1]);
        }
        p_Var1 = ctxt_00->sax;
        ctxt_00->sax = oldctxt->sax;
        xmlDetectSAX2(ctxt_00);
        ctxt_00->replaceEntities = oldctxt->replaceEntities;
        ctxt_00->options = oldctxt->options;
        ctxt_00->_private = oldctxt->_private;
        if (oldctxt->myDoc == (xmlDocPtr)0x0) {
          newRoot = (xmlNodePtr)xmlNewDoc("1.0");
          if ((xmlDocPtr)newRoot == (xmlDocPtr)0x0) {
            ctxt_00->sax = p_Var1;
            ctxt_00->dict = (xmlDictPtr)0x0;
            xmlFreeParserCtxt(ctxt_00);
            return XML_ERR_INTERNAL_ERROR;
          }
          ((xmlDocPtr)newRoot)->properties = 0x40;
          ((xmlDocPtr)newRoot)->dict = ctxt_00->dict;
          xmlDictReference(((xmlDocPtr)newRoot)->dict);
          ctxt_00->myDoc = (xmlDocPtr)newRoot;
        }
        else {
          ctxt_00->myDoc = oldctxt->myDoc;
          last = ctxt_00->myDoc->children;
          _ret = ctxt_00->myDoc->last;
        }
        cur_00 = xmlNewDocNode(ctxt_00->myDoc,(xmlNsPtr)0x0,(xmlChar *)"pseudoroot",(xmlChar *)0x0);
        if (cur_00 == (xmlNodePtr)0x0) {
          ctxt_00->sax = p_Var1;
          ctxt_00->dict = (xmlDictPtr)0x0;
          xmlFreeParserCtxt(ctxt_00);
          if (newRoot != (xmlNodePtr)0x0) {
            xmlFreeDoc((xmlDocPtr)newRoot);
          }
          oldctxt_local._4_4_ = XML_ERR_INTERNAL_ERROR;
        }
        else {
          ctxt_00->myDoc->children = (_xmlNode *)0x0;
          ctxt_00->myDoc->last = (_xmlNode *)0x0;
          xmlAddChild((xmlNodePtr)ctxt_00->myDoc,cur_00);
          nodePush(ctxt_00,ctxt_00->myDoc->children);
          ctxt_00->instate = XML_PARSER_CONTENT;
          ctxt_00->depth = oldctxt->depth + 1;
          ctxt_00->validate = 0;
          ctxt_00->loadsubset = oldctxt->loadsubset;
          if ((oldctxt->validate != 0) || (oldctxt->replaceEntities != 0)) {
            ctxt_00->loadsubset = ctxt_00->loadsubset | 8;
          }
          ctxt_00->dictNames = oldctxt->dictNames;
          ctxt_00->attsDefault = oldctxt->attsDefault;
          ctxt_00->attsSpecial = oldctxt->attsSpecial;
          xmlParseContent(ctxt_00);
          if ((*ctxt_00->input->cur == '<') && (ctxt_00->input->cur[1] == '/')) {
            xmlFatalErr(ctxt_00,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
          }
          else if (*ctxt_00->input->cur != '\0') {
            xmlFatalErr(ctxt_00,XML_ERR_EXTRA_CONTENT,(char *)0x0);
          }
          if (ctxt_00->node != ctxt_00->myDoc->children) {
            xmlFatalErr(ctxt_00,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
          }
          if (ctxt_00->wellFormed == 0) {
            if (ctxt_00->errNo == 0) {
              local_68 = XML_ERR_INTERNAL_ERROR;
            }
            else {
              local_68 = ctxt_00->errNo;
            }
          }
          else {
            local_68 = XML_ERR_OK;
          }
          if ((lst != (xmlNodePtr *)0x0) && (local_68 == XML_ERR_OK)) {
            local_78 = ctxt_00->myDoc->children->children;
            *lst = local_78;
            for (; local_78 != (xmlNodePtr)0x0; local_78 = local_78->next) {
              if ((((oldctxt->validate != 0) && (oldctxt->wellFormed != 0)) &&
                  (oldctxt->myDoc != (xmlDocPtr)0x0)) &&
                 ((oldctxt->myDoc->intSubset != (_xmlDtd *)0x0 &&
                  (local_78->type == XML_ELEMENT_NODE)))) {
                uVar2 = xmlValidateElement(&oldctxt->vctxt,oldctxt->myDoc,local_78);
                oldctxt->valid = uVar2 & oldctxt->valid;
              }
              local_78->parent = (_xmlNode *)0x0;
            }
            ctxt_00->myDoc->children->children = (_xmlNode *)0x0;
          }
          if (ctxt_00->myDoc != (xmlDocPtr)0x0) {
            xmlFreeNode(ctxt_00->myDoc->children);
            ctxt_00->myDoc->children = last;
            ctxt_00->myDoc->last = _ret;
          }
          if (oldctxt != (xmlParserCtxtPtr)0x0) {
            oldctxt->nbentities = ctxt_00->nbentities + oldctxt->nbentities;
          }
          if ((ctxt_00->lastError).code != 0) {
            xmlCopyError(&ctxt_00->lastError,&oldctxt->lastError);
          }
          ctxt_00->sax = p_Var1;
          ctxt_00->dict = (xmlDictPtr)0x0;
          ctxt_00->attsDefault = (xmlHashTablePtr)0x0;
          ctxt_00->attsSpecial = (xmlHashTablePtr)0x0;
          xmlFreeParserCtxt(ctxt_00);
          if (newRoot != (xmlNodePtr)0x0) {
            xmlFreeDoc((xmlDocPtr)newRoot);
          }
          oldctxt_local._4_4_ = local_68;
        }
      }
    }
  }
  else {
    oldctxt_local._4_4_ = XML_ERR_ENTITY_LOOP;
  }
  return oldctxt_local._4_4_;
}

Assistant:

static xmlParserErrors
xmlParseBalancedChunkMemoryInternal(xmlParserCtxtPtr oldctxt,
	const xmlChar *string, void *user_data, xmlNodePtr *lst) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr newDoc = NULL;
    xmlNodePtr newRoot;
    xmlSAXHandlerPtr oldsax = NULL;
    xmlNodePtr content = NULL;
    xmlNodePtr last = NULL;
    int size;
    xmlParserErrors ret = XML_ERR_OK;
#ifdef SAX2
    int i;
#endif

    if (((oldctxt->depth > 40) && ((oldctxt->options & XML_PARSE_HUGE) == 0)) ||
        (oldctxt->depth >  1024)) {
	return(XML_ERR_ENTITY_LOOP);
    }


    if (lst != NULL)
        *lst = NULL;
    if (string == NULL)
        return(XML_ERR_INTERNAL_ERROR);

    size = xmlStrlen(string);

    ctxt = xmlCreateMemoryParserCtxt((char *) string, size);
    if (ctxt == NULL) return(XML_WAR_UNDECLARED_ENTITY);
    if (user_data != NULL)
	ctxt->userData = user_data;
    else
	ctxt->userData = ctxt;
    if (ctxt->dict != NULL) xmlDictFree(ctxt->dict);
    ctxt->dict = oldctxt->dict;
    ctxt->input_id = oldctxt->input_id + 1;
    ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
    ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
    ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);

#ifdef SAX2
    /* propagate namespaces down the entity */
    for (i = 0;i < oldctxt->nsNr;i += 2) {
        nsPush(ctxt, oldctxt->nsTab[i], oldctxt->nsTab[i+1]);
    }
#endif

    oldsax = ctxt->sax;
    ctxt->sax = oldctxt->sax;
    xmlDetectSAX2(ctxt);
    ctxt->replaceEntities = oldctxt->replaceEntities;
    ctxt->options = oldctxt->options;

    ctxt->_private = oldctxt->_private;
    if (oldctxt->myDoc == NULL) {
	newDoc = xmlNewDoc(BAD_CAST "1.0");
	if (newDoc == NULL) {
	    ctxt->sax = oldsax;
	    ctxt->dict = NULL;
	    xmlFreeParserCtxt(ctxt);
	    return(XML_ERR_INTERNAL_ERROR);
	}
	newDoc->properties = XML_DOC_INTERNAL;
	newDoc->dict = ctxt->dict;
	xmlDictReference(newDoc->dict);
	ctxt->myDoc = newDoc;
    } else {
	ctxt->myDoc = oldctxt->myDoc;
        content = ctxt->myDoc->children;
	last = ctxt->myDoc->last;
    }
    newRoot = xmlNewDocNode(ctxt->myDoc, NULL, BAD_CAST "pseudoroot", NULL);
    if (newRoot == NULL) {
	ctxt->sax = oldsax;
	ctxt->dict = NULL;
	xmlFreeParserCtxt(ctxt);
	if (newDoc != NULL) {
	    xmlFreeDoc(newDoc);
	}
	return(XML_ERR_INTERNAL_ERROR);
    }
    ctxt->myDoc->children = NULL;
    ctxt->myDoc->last = NULL;
    xmlAddChild((xmlNodePtr) ctxt->myDoc, newRoot);
    nodePush(ctxt, ctxt->myDoc->children);
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->depth = oldctxt->depth + 1;

    ctxt->validate = 0;
    ctxt->loadsubset = oldctxt->loadsubset;
    if ((oldctxt->validate) || (oldctxt->replaceEntities != 0)) {
	/*
	 * ID/IDREF registration will be done in xmlValidateElement below
	 */
	ctxt->loadsubset |= XML_SKIP_IDS;
    }
    ctxt->dictNames = oldctxt->dictNames;
    ctxt->attsDefault = oldctxt->attsDefault;
    ctxt->attsSpecial = oldctxt->attsSpecial;

    xmlParseContent(ctxt);
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if (ctxt->node != ctxt->myDoc->children) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
      ret = XML_ERR_OK;
    }

    if ((lst != NULL) && (ret == XML_ERR_OK)) {
	xmlNodePtr cur;

	/*
	 * Return the newly created nodeset after unlinking it from
	 * they pseudo parent.
	 */
	cur = ctxt->myDoc->children->children;
	*lst = cur;
	while (cur != NULL) {
#ifdef LIBXML_VALID_ENABLED
	    if ((oldctxt->validate) && (oldctxt->wellFormed) &&
		(oldctxt->myDoc) && (oldctxt->myDoc->intSubset) &&
		(cur->type == XML_ELEMENT_NODE)) {
		oldctxt->valid &= xmlValidateElement(&oldctxt->vctxt,
			oldctxt->myDoc, cur);
	    }
#endif /* LIBXML_VALID_ENABLED */
	    cur->parent = NULL;
	    cur = cur->next;
	}
	ctxt->myDoc->children->children = NULL;
    }
    if (ctxt->myDoc != NULL) {
	xmlFreeNode(ctxt->myDoc->children);
        ctxt->myDoc->children = content;
        ctxt->myDoc->last = last;
    }

    /*
     * Record in the parent context the number of entities replacement
     * done when parsing that reference.
     */
    if (oldctxt != NULL)
        oldctxt->nbentities += ctxt->nbentities;

    /*
     * Also record the last error if any
     */
    if (ctxt->lastError.code != XML_ERR_OK)
        xmlCopyError(&ctxt->lastError, &oldctxt->lastError);

    ctxt->sax = oldsax;
    ctxt->dict = NULL;
    ctxt->attsDefault = NULL;
    ctxt->attsSpecial = NULL;
    xmlFreeParserCtxt(ctxt);
    if (newDoc != NULL) {
	xmlFreeDoc(newDoc);
    }

    return(ret);
}